

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

int __thiscall duckdb_re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  uint uVar1;
  Inst *pIVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint32_t uVar8;
  Frag FVar9;
  
  FVar9 = FindByteRange(this,root,id);
  uVar8 = FVar9.begin;
  if (uVar8 == 0) {
    uVar6 = AllocInst(this,1);
    if (-1 < (int)uVar6) {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl +
                          uVar6,root,id);
      return uVar6;
    }
  }
  else {
    uVar7 = FVar9._0_8_ >> 0x20;
    uVar6 = root;
    if (uVar7 != 0) {
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      if ((uVar7 & 1) == 0) {
        uVar6 = pIVar2[(int)uVar8].out_opcode_ >> 4;
      }
      else {
        uVar6 = pIVar2[(int)uVar8].field_1.cap_;
      }
    }
    bVar3 = IsCachedRuneByteSuffix(this,uVar6);
    if (bVar3) {
      uVar4 = AllocInst(this,1);
      uVar1 = root;
      if (-1 < (int)uVar4) {
        pIVar2 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                 .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
        Prog::Inst::InitByteRange
                  (pIVar2 + uVar4,(uint)pIVar2[(int)uVar6].field_1.byte_range.lo_,
                   (uint)pIVar2[(int)uVar6].field_1.byte_range.hi_,
                   pIVar2[(int)uVar6].field_1.byte_range.hint_foldcase_ & 1,
                   pIVar2[(int)uVar6].out_opcode_ >> 4);
        uVar6 = uVar4;
        uVar1 = uVar4;
        if (uVar7 != 0) {
          pIVar2 = (this->inst_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                   .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
          if ((uVar7 & 1) == 0) {
            pIVar2[(int)uVar8].out_opcode_ = pIVar2[(int)uVar8].out_opcode_ & 0xf | uVar4 << 4;
            uVar1 = root;
          }
          else {
            pIVar2[(int)uVar8].field_1.cap_ = uVar4;
            uVar1 = root;
          }
        }
      }
      root = uVar1;
      if ((int)uVar4 < 0) {
        return 0;
      }
    }
    pIVar2 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar1 = pIVar2[id].out_opcode_;
    bVar3 = IsCachedRuneByteSuffix(this,id);
    if (!bVar3) {
      pIVar2 = pIVar2 + id;
      pIVar2->out_opcode_ = 0;
      pIVar2->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
      this->ninst_ = this->ninst_ + -1;
    }
    iVar5 = AddSuffixRecursive(this,(this->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
                                    .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>.
                                    _M_head_impl[(int)uVar6].out_opcode_ >> 4,uVar1 >> 4);
    if (iVar5 != 0) {
      pIVar2 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
               .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
      pIVar2[(int)uVar6].out_opcode_ = pIVar2[(int)uVar6].out_opcode_ & 0xf | iVar5 << 4;
      return root;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.head == 0)
    br = root;
  else if (f.end.head&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.head == 0)
      root = br;
    else if (f.end.head&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, ninst_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    ninst_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}